

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O0

void Kit_PlaToTruth(char *pSop,int nVars,Vec_Ptr_t *vVars,uint *pTemp,uint *pTruth)

{
  size_t sVar1;
  uint *puVar2;
  bool bVar3;
  int fCompl;
  int nCubes;
  int c;
  int v;
  uint *pTruth_local;
  uint *pTemp_local;
  Vec_Ptr_t *vVars_local;
  char *pcStack_10;
  int nVars_local;
  char *pSop_local;
  
  bVar3 = false;
  if (pSop == (char *)0x0) {
    __assert_fail("pSop != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitPla.c"
                  ,499,
                  "void Kit_PlaToTruth(char *, int, Vec_Ptr_t *, unsigned int *, unsigned int *)");
  }
  if (nVars < 0) {
    __assert_fail("nVars >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitPla.c"
                  ,500,
                  "void Kit_PlaToTruth(char *, int, Vec_Ptr_t *, unsigned int *, unsigned int *)");
  }
  sVar1 = strlen(pSop);
  if (sVar1 % (ulong)(long)(nVars + 3) == 0) {
    Kit_TruthClear(pTruth,nVars);
    sVar1 = strlen(pSop);
    pcStack_10 = pSop;
    for (fCompl = 0; fCompl < (int)(sVar1 / (ulong)(long)(nVars + 3)); fCompl = fCompl + 1) {
      bVar3 = pcStack_10[nVars + 1] == '0';
      Kit_TruthFill(pTemp,nVars);
      for (nCubes = 0; nCubes < nVars; nCubes = nCubes + 1) {
        if (pcStack_10[nCubes] == '1') {
          puVar2 = (uint *)Vec_PtrEntry(vVars,nCubes);
          Kit_TruthAnd(pTemp,pTemp,puVar2,nVars);
        }
        else if (pcStack_10[nCubes] == '0') {
          puVar2 = (uint *)Vec_PtrEntry(vVars,nCubes);
          Kit_TruthSharp(pTemp,pTemp,puVar2,nVars);
        }
      }
      Kit_TruthOr(pTruth,pTruth,pTemp,nVars);
      pcStack_10 = pcStack_10 + (nVars + 3);
    }
    if (bVar3) {
      Kit_TruthNot(pTruth,pTruth,nVars);
    }
  }
  else {
    printf("Kit_PlaToTruth(): SOP is represented incorrectly.\n");
  }
  return;
}

Assistant:

void Kit_PlaToTruth( char * pSop, int nVars, Vec_Ptr_t * vVars, unsigned * pTemp, unsigned * pTruth )
{
    int v, c, nCubes, fCompl = 0;
    assert( pSop != NULL );
    assert( nVars >= 0 );
    if ( strlen(pSop) % (nVars + 3) != 0 )
    {
        printf( "Kit_PlaToTruth(): SOP is represented incorrectly.\n" );
        return;
    }
    // iterate through the cubes
    Kit_TruthClear( pTruth, nVars );
    nCubes =  strlen(pSop) / (nVars + 3);
    for ( c = 0; c < nCubes; c++ )
    {
        fCompl = (pSop[nVars+1] == '0');
        Kit_TruthFill( pTemp, nVars );
        // iterate through the literals of the cube
        for ( v = 0; v < nVars; v++ )
            if ( pSop[v] == '1' )
                Kit_TruthAnd( pTemp, pTemp, (unsigned *)Vec_PtrEntry(vVars, v), nVars );
            else if ( pSop[v] == '0' )
                Kit_TruthSharp( pTemp, pTemp, (unsigned *)Vec_PtrEntry(vVars, v), nVars );
        // add cube to storage
        Kit_TruthOr( pTruth, pTruth, pTemp, nVars );
        // go to the next cube
        pSop += (nVars + 3);
    }
    if ( fCompl )
        Kit_TruthNot( pTruth, pTruth, nVars );
}